

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O1

expression * copy_expression(dmr_C *C,expression *expr)

{
  byte bVar1;
  position pVar2;
  ptr_list *ppVar3;
  undefined8 uVar4;
  string *psVar5;
  expression *peVar6;
  expression *peVar7;
  unsigned_long_long uVar8;
  undefined4 uVar9;
  int iVar10;
  expression *peVar11;
  symbol *psVar12;
  symbol *psVar13;
  expression *peVar14;
  expression *peVar15;
  expression *peVar16;
  expression *cast;
  undefined1 local_58 [8];
  ptr_list_iter argiter__;
  
  if (expr == (expression *)0x0) {
    return (expression *)0x0;
  }
  bVar1 = *(byte *)expr;
  peVar15 = expr;
  switch(bVar1) {
  case 1:
  case 2:
  case 4:
  case 0x1c:
    break;
  case 3:
    psVar12 = copy_symbol(C,expr->pos,(expr->field_5).field_4.symbol);
    if (psVar12 != (symbol *)(expr->field_5).field_0.value) {
      peVar15 = dup_expression(C,expr);
      (peVar15->field_5).field_4.symbol = psVar12;
    }
    break;
  case 5:
  case 7:
  case 0x15:
  case 0x16:
    peVar14 = copy_expression(C,(expr->field_5).field_3.unop);
    peVar16 = copy_expression(C,(expr->field_5).field_6.right);
    if ((peVar14 != (expression *)(expr->field_5).field_0.value) ||
       (peVar16 != (expression *)(expr->field_5).field_2.string)) {
      bVar1 = *(byte *)expr;
      pVar2 = expr->pos;
      peVar15 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
      *(byte *)peVar15 = bVar1;
      peVar15->pos = pVar2;
      uVar9 = *(undefined4 *)&expr->field_0x0;
      iVar10 = expr->op;
      pVar2 = expr->pos;
      psVar12 = expr->ctype;
      uVar4 = *(undefined8 *)&expr->field_0x18;
      psVar5 = (expr->field_5).field_2.string;
      peVar11 = (expr->field_5).field_10.cond_false;
      peVar6 = (expr->field_5).field_14.ident_expression;
      (peVar15->field_5).field_0.value = (expr->field_5).field_0.value;
      (peVar15->field_5).field_2.string = psVar5;
      *(undefined4 *)&peVar15->field_0x0 = uVar9;
      peVar15->op = iVar10;
      peVar15->pos = pVar2;
      peVar15->ctype = psVar12;
      *(undefined8 *)&peVar15->field_0x18 = uVar4;
      (peVar15->field_5).field_10.cond_false = peVar11;
      (peVar15->field_5).field_14.ident_expression = peVar6;
      (peVar15->field_5).field_3.unop = peVar14;
      (peVar15->field_5).field_6.right = peVar16;
    }
    break;
  case 6:
    peVar14 = copy_expression(C,(expr->field_5).field_3.unop);
    peVar16 = copy_expression(C,(expr->field_5).field_6.right);
    if (((expr->op != 0x3d) || (peVar14 != (expression *)(expr->field_5).field_0.value)) ||
       (peVar16 != (expression *)(expr->field_5).field_2.string)) {
      peVar15 = dup_expression(C,expr);
      (peVar15->field_5).field_3.unop = peVar14;
      (peVar15->field_5).field_6.right = peVar16;
    }
    break;
  case 8:
  case 0x1d:
    psVar12 = (symbol *)copy_expression(C,(expr->field_5).field_3.unop);
    goto LAB_00113d4f;
  case 9:
  case 10:
    psVar12 = (symbol *)copy_expression(C,(expr->field_5).field_3.unop);
    if ((symbol *)(expr->field_5).field_0.value == psVar12) {
      return expr;
    }
    goto LAB_00113d4f;
  case 0xb:
    peVar14 = (expr->field_5).field_6.right;
    if (*(char *)peVar14 == '\x18') {
      psVar12 = (expr->field_5).field_4.symbol;
      peVar15 = dup_expression(C,expr);
      peVar14 = copy_expression(C,peVar14);
      (peVar15->field_5).field_6.right = peVar14;
      psVar13 = dmrC_alloc_symbol(C->S,psVar12->pos,(uint)*(byte *)psVar12);
      (peVar15->field_5).field_4.symbol = psVar13;
      memcpy(psVar13,psVar12,0xe8);
      return peVar15;
    }
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    peVar14 = copy_expression(C,(expr->field_5).field_6.right);
    if (peVar14 != (expression *)(expr->field_5).field_2.string) {
LAB_00113b48:
      bVar1 = *(byte *)expr;
      pVar2 = expr->pos;
      peVar15 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
      *(byte *)peVar15 = bVar1;
      peVar15->pos = pVar2;
      uVar9 = *(undefined4 *)&expr->field_0x0;
      iVar10 = expr->op;
      pVar2 = expr->pos;
      psVar12 = expr->ctype;
      uVar4 = *(undefined8 *)&expr->field_0x18;
      psVar5 = (expr->field_5).field_2.string;
      peVar16 = (expr->field_5).field_10.cond_false;
      peVar11 = (expr->field_5).field_14.ident_expression;
      (peVar15->field_5).field_0.value = (expr->field_5).field_0.value;
      (peVar15->field_5).field_2.string = psVar5;
      *(undefined4 *)&peVar15->field_0x0 = uVar9;
      peVar15->op = iVar10;
      peVar15->pos = pVar2;
      peVar15->ctype = psVar12;
      *(undefined8 *)&peVar15->field_0x18 = uVar4;
      (peVar15->field_5).field_10.cond_false = peVar16;
      (peVar15->field_5).field_14.ident_expression = peVar11;
      (peVar15->field_5).field_6.right = peVar14;
    }
    break;
  case 0x11:
  case 0x12:
    peVar14 = copy_expression(C,(expr->field_5).field_3.unop);
    peVar16 = copy_expression(C,(expr->field_5).field_6.right);
    peVar11 = copy_expression(C,(expr->field_5).field_10.cond_false);
    if (((peVar14 != (expression *)(expr->field_5).field_0.value) ||
        (peVar16 != (expression *)(expr->field_5).field_2.string)) ||
       (peVar11 != (expr->field_5).field_10.cond_false)) {
      bVar1 = *(byte *)expr;
      pVar2 = expr->pos;
      peVar15 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
      *(byte *)peVar15 = bVar1;
      peVar15->pos = pVar2;
      uVar9 = *(undefined4 *)&expr->field_0x0;
      iVar10 = expr->op;
      pVar2 = expr->pos;
      psVar12 = expr->ctype;
      uVar4 = *(undefined8 *)&expr->field_0x18;
      psVar5 = (expr->field_5).field_2.string;
      peVar6 = (expr->field_5).field_10.cond_false;
      peVar7 = (expr->field_5).field_14.ident_expression;
      (peVar15->field_5).field_0.value = (expr->field_5).field_0.value;
      (peVar15->field_5).field_2.string = psVar5;
      (peVar15->field_5).field_10.cond_false = peVar6;
      (peVar15->field_5).field_14.ident_expression = peVar7;
      *(undefined4 *)&peVar15->field_0x0 = uVar9;
      peVar15->op = iVar10;
      peVar15->pos = pVar2;
      peVar15->ctype = psVar12;
      *(undefined8 *)&peVar15->field_0x18 = uVar4;
      (peVar15->field_5).field_3.unop = peVar14;
      (peVar15->field_5).field_6.right = peVar16;
      (peVar15->field_5).field_10.cond_false = peVar11;
    }
    break;
  case 0x13:
    psVar12 = (symbol *)dmrC_alloc_statement(C,expr->pos,3);
    dmrC_copy_statement(C,(expr->field_5).statement,(statement *)psVar12);
    goto LAB_00113d4f;
  case 0x14:
    argiter__._16_8_ = copy_expression(C,(expr->field_5).field_3.unop);
    ppVar3 = (ptr_list *)(expr->field_5).field_2.string;
    bVar1 = *(byte *)expr;
    pVar2 = expr->pos;
    peVar15 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(byte *)peVar15 = bVar1;
    peVar15->pos = pVar2;
    uVar9 = *(undefined4 *)&expr->field_0x0;
    iVar10 = expr->op;
    pVar2 = expr->pos;
    psVar12 = expr->ctype;
    uVar4 = *(undefined8 *)&expr->field_0x18;
    psVar5 = (expr->field_5).field_2.string;
    peVar14 = (expr->field_5).field_10.cond_false;
    peVar16 = (expr->field_5).field_14.ident_expression;
    (peVar15->field_5).field_0.value = (expr->field_5).field_0.value;
    (peVar15->field_5).field_2.string = psVar5;
    *(undefined4 *)&peVar15->field_0x0 = uVar9;
    peVar15->op = iVar10;
    peVar15->pos = pVar2;
    peVar15->ctype = psVar12;
    *(undefined8 *)&peVar15->field_0x18 = uVar4;
    (peVar15->field_5).field_10.cond_false = peVar14;
    (peVar15->field_5).field_14.ident_expression = peVar16;
    (peVar15->field_5).field_0.value = argiter__._16_8_;
    (peVar15->field_5).field_2.string = (string *)0x0;
    ptrlist_forward_iterator((ptr_list_iter *)local_58,ppVar3);
    peVar14 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_58);
    if (peVar14 != (expression *)0x0) {
      do {
        peVar14 = copy_expression(C,peVar14);
        ptrlist_add((ptr_list **)&(peVar15->field_5).field_2.string,peVar14,&C->ptrlist_allocator);
        peVar14 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_58);
      } while (peVar14 != (expression *)0x0);
    }
    break;
  case 0x17:
    psVar12 = copy_symbol(C,expr->pos,(expr->field_5).field_4.symbol);
LAB_00113d4f:
    bVar1 = *(byte *)expr;
    pVar2 = expr->pos;
    peVar15 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(byte *)peVar15 = bVar1;
    peVar15->pos = pVar2;
    uVar9 = *(undefined4 *)&expr->field_0x0;
    iVar10 = expr->op;
    pVar2 = expr->pos;
    psVar13 = expr->ctype;
    uVar4 = *(undefined8 *)&expr->field_0x18;
    psVar5 = (expr->field_5).field_2.string;
    peVar14 = (expr->field_5).field_10.cond_false;
    peVar16 = (expr->field_5).field_14.ident_expression;
    (peVar15->field_5).field_0.value = (expr->field_5).field_0.value;
    (peVar15->field_5).field_2.string = psVar5;
    *(undefined4 *)&peVar15->field_0x0 = uVar9;
    peVar15->op = iVar10;
    peVar15->pos = pVar2;
    peVar15->ctype = psVar13;
    *(undefined8 *)&peVar15->field_0x18 = uVar4;
    (peVar15->field_5).field_10.cond_false = peVar14;
    (peVar15->field_5).field_14.ident_expression = peVar16;
    (peVar15->field_5).statement = (statement *)psVar12;
    break;
  case 0x18:
    pVar2 = expr->pos;
    ppVar3 = (ptr_list *)(expr->field_5).field_3.unop;
    peVar15 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(byte *)peVar15 = bVar1;
    peVar15->pos = pVar2;
    uVar9 = *(undefined4 *)&expr->field_0x0;
    iVar10 = expr->op;
    pVar2 = expr->pos;
    psVar12 = expr->ctype;
    uVar4 = *(undefined8 *)&expr->field_0x18;
    psVar5 = (expr->field_5).field_2.string;
    peVar14 = (expr->field_5).field_10.cond_false;
    peVar16 = (expr->field_5).field_14.ident_expression;
    (peVar15->field_5).field_0.value = (expr->field_5).field_0.value;
    (peVar15->field_5).field_2.string = psVar5;
    *(undefined4 *)&peVar15->field_0x0 = uVar9;
    peVar15->op = iVar10;
    peVar15->pos = pVar2;
    peVar15->ctype = psVar12;
    *(undefined8 *)&peVar15->field_0x18 = uVar4;
    (peVar15->field_5).field_10.cond_false = peVar14;
    (peVar15->field_5).field_14.ident_expression = peVar16;
    (peVar15->field_5).field_0.value = 0;
    ptrlist_forward_iterator((ptr_list_iter *)local_58,ppVar3);
    peVar14 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_58);
    if (peVar14 != (expression *)0x0) {
      do {
        peVar14 = copy_expression(C,peVar14);
        ptrlist_add((ptr_list **)&(peVar15->field_5).statement,peVar14,&C->ptrlist_allocator);
        peVar14 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_58);
      } while (peVar14 != (expression *)0x0);
    }
    break;
  case 0x19:
    peVar16 = copy_expression(C,(expr->field_5).field_14.ident_expression);
    bVar1 = *(byte *)expr;
    pVar2 = expr->pos;
    peVar15 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
    *(byte *)peVar15 = bVar1;
    peVar15->pos = pVar2;
    uVar9 = *(undefined4 *)&expr->field_0x0;
    iVar10 = expr->op;
    pVar2 = expr->pos;
    psVar12 = expr->ctype;
    uVar4 = *(undefined8 *)&expr->field_0x18;
    uVar8 = (expr->field_5).field_0.value;
    psVar5 = (expr->field_5).field_2.string;
    peVar14 = (expr->field_5).field_14.ident_expression;
    (peVar15->field_5).field_10.cond_false = (expr->field_5).field_10.cond_false;
    (peVar15->field_5).field_14.ident_expression = peVar14;
    *(undefined4 *)&peVar15->field_0x0 = uVar9;
    peVar15->op = iVar10;
    peVar15->pos = pVar2;
    peVar15->ctype = psVar12;
    *(undefined8 *)&peVar15->field_0x18 = uVar4;
    (peVar15->field_5).field_0.value = uVar8;
    (peVar15->field_5).field_2.string = psVar5;
    (peVar15->field_5).field_14.ident_expression = peVar16;
    break;
  case 0x1a:
  case 0x1b:
    peVar14 = copy_expression(C,(expr->field_5).field_6.right);
    goto LAB_00113b48;
  case 0x1e:
    peVar14 = copy_expression(C,(expr->field_5).field_6.right);
    if (expr->op == 0x2e) {
      if ((expression *)(expr->field_5).field_2.string != peVar14) {
        peVar15 = dup_expression(C,expr);
        (peVar15->field_5).field_6.right = peVar14;
      }
    }
    else {
      peVar16 = copy_expression(C,(expr->field_5).field_10.cond_false);
      if (((expression *)(expr->field_5).field_2.string != peVar14) ||
         ((expr->field_5).field_10.cond_false != peVar16)) {
        peVar15 = dup_expression(C,expr);
        (peVar15->field_5).field_6.right = peVar14;
        (peVar15->field_5).field_10.cond_false = peVar16;
      }
    }
    break;
  default:
    dmrC_warning(C,expr->pos,"trying to copy expression type %d",(ulong)bVar1);
  }
  return peVar15;
}

Assistant:

static struct expression * copy_expression(struct dmr_C *C, struct expression *expr)
{
	if (!expr)
		return NULL;

	switch (expr->type) {
	/*
	 * EXPR_SYMBOL is the interesting case, we may need to replace the
	 * symbol to the new copy.
	 */
	case EXPR_SYMBOL: {
		struct symbol *sym = copy_symbol(C, expr->pos, expr->symbol);
		if (sym == expr->symbol)
			break;
		expr = dup_expression(C, expr);
		expr->symbol = sym;
		break;
	}

	/* Atomics, never change, just return the expression directly */
	case EXPR_VALUE:
	case EXPR_STRING:
	case EXPR_FVALUE:
	case EXPR_TYPE:
		break;

	/* Unops: check if the subexpression is unique */
	case EXPR_PREOP:
	case EXPR_POSTOP: {
		struct expression *unop = copy_expression(C, expr->unop);
		if (expr->unop == unop)
			break;
		expr = dup_expression(C, expr);
		expr->unop = unop;
		break;
	}

	case EXPR_SLICE: {
		struct expression *base = copy_expression(C, expr->base);
		expr = dup_expression(C, expr);
		expr->base = base;
		break;
	}

	/* Binops: copy left/right expressions */
	case EXPR_BINOP:
	case EXPR_COMMA:
	case EXPR_COMPARE:
	case EXPR_LOGICAL: {
		struct expression *left = copy_expression(C, expr->left);
		struct expression *right = copy_expression(C, expr->right);
		if (left == expr->left && right == expr->right)
			break;
		expr = dup_expression(C, expr);
		expr->left = left;
		expr->right = right;
		break;
	}

	case EXPR_ASSIGNMENT: {
		struct expression *left = copy_expression(C, expr->left);
		struct expression *right = copy_expression(C, expr->right);
		if (expr->op == '=' && left == expr->left && right == expr->right)
			break;
		expr = dup_expression(C, expr);
		expr->left = left;
		expr->right = right;
		break;
	}

	/* Dereference */
	case EXPR_DEREF: {
		struct expression *deref = copy_expression(C, expr->deref);
		expr = dup_expression(C, expr);
		expr->deref = deref;
		break;
	}

	/* Cast/sizeof/__alignof__ */
	case EXPR_CAST:
		if (expr->cast_expression->type == EXPR_INITIALIZER) {
			struct expression *cast = expr->cast_expression;
			struct symbol *sym = expr->cast_type;
			expr = dup_expression(C, expr);
			expr->cast_expression = copy_expression(C, cast);
			expr->cast_type = dmrC_alloc_symbol(C->S, sym->pos, sym->type);
			*expr->cast_type = *sym;
			break;
		}
	case EXPR_FORCE_CAST:
	case EXPR_IMPLIED_CAST:
	case EXPR_SIZEOF: 
	case EXPR_PTRSIZEOF:
	case EXPR_ALIGNOF: {
		struct expression *cast = copy_expression(C, expr->cast_expression);
		if (cast == expr->cast_expression)
			break;
		expr = dup_expression(C, expr);
		expr->cast_expression = cast;
		break;
	}

	/* Conditional expression */
	case EXPR_SELECT:
	case EXPR_CONDITIONAL: {
		struct expression *cond = copy_expression(C, expr->conditional);
		struct expression *truee = copy_expression(C, expr->cond_true);
		struct expression *falsee = copy_expression(C, expr->cond_false);
		if (cond == expr->conditional && truee == expr->cond_true && falsee == expr->cond_false)
			break;
		expr = dup_expression(C, expr);
		expr->conditional = cond;
		expr->cond_true = truee;
		expr->cond_false = falsee;
		break;
	}

	/* Statement expression */
	case EXPR_STATEMENT: {
		struct statement *stmt = dmrC_alloc_statement(C, expr->pos, STMT_COMPOUND);
		dmrC_copy_statement(C, expr->statement, stmt);
		expr = dup_expression(C, expr);
		expr->statement = stmt;
		break;
	}

	/* Call expression */
	case EXPR_CALL: {
		struct expression *fn = copy_expression(C, expr->fn);
		struct expression_list *list = expr->args;
		struct expression *arg;

		expr = dup_expression(C, expr);
		expr->fn = fn;
		expr->args = NULL;
		FOR_EACH_PTR(list, arg) {
			dmrC_add_expression(C, &expr->args, copy_expression(C, arg));
		} END_FOR_EACH_PTR(arg);
		break;
	}

	/* Initializer list statement */
	case EXPR_INITIALIZER: {
		struct expression_list *list = expr->expr_list;
		struct expression *entry;
		expr = dup_expression(C, expr);
		expr->expr_list = NULL;
		FOR_EACH_PTR(list, entry) {
			dmrC_add_expression(C, &expr->expr_list, copy_expression(C, entry));
		} END_FOR_EACH_PTR(entry);
		break;
	}

	/* Label in inline function - hmm. */
	case EXPR_LABEL: {
		struct symbol *label_symbol = copy_symbol(C, expr->pos, expr->label_symbol);
		expr = dup_expression(C, expr);
		expr->label_symbol = label_symbol;
		break;
	}

	case EXPR_INDEX: {
		struct expression *sub_expr = copy_expression(C, expr->idx_expression);
		expr = dup_expression(C, expr);
		expr->idx_expression = sub_expr;
		break;
	}
		
	case EXPR_IDENTIFIER: {
		struct expression *sub_expr = copy_expression(C, expr->ident_expression);
		expr = dup_expression(C, expr);
		expr->ident_expression = sub_expr;
		break;
	}

	/* Position in initializer.. */
	case EXPR_POS: {
		struct expression *val = copy_expression(C, expr->init_expr);
		expr = dup_expression(C, expr);
		expr->init_expr = val;
		break;
	}
	case EXPR_OFFSETOF: {
		struct expression *val = copy_expression(C, expr->down);
		if (expr->op == '.') {
			if (expr->down != val) {
				expr = dup_expression(C, expr);
				expr->down = val;
			}
		} else {
			struct expression *idx = copy_expression(C, expr->index);
			if (expr->down != val || expr->index != idx) {
				expr = dup_expression(C, expr);
				expr->down = val;
				expr->index = idx;
			}
		}
		break;
	}
	default:
		dmrC_warning(C, expr->pos, "trying to copy expression type %d", expr->type);
	}
	return expr;
}